

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O3

void duckdb::DecimalRoundNegativePrecisionFunction<short,duckdb::NumericHelper>
               (DataChunk *input,ExpressionState *state,Vector *result)

{
  short sVar1;
  short sVar2;
  int iVar3;
  UnifiedVectorFormat *pUVar4;
  short *psVar5;
  short *psVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  undefined8 uVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  byte bVar13;
  uint uVar14;
  BoundFunctionExpression *pBVar15;
  pointer pFVar16;
  const_reference pvVar17;
  pointer pEVar18;
  reference vector;
  UnifiedVectorFormat *pUVar19;
  TemplatedValidityData<unsigned_long> *pTVar20;
  _Head_base<0UL,_unsigned_long_*,_false> _Var21;
  short sVar22;
  short sVar23;
  ulong uVar24;
  short sVar25;
  VectorType VVar26;
  ulong uVar27;
  UnifiedVectorFormat *pUVar28;
  idx_t idx_in_entry;
  UnifiedVectorFormat *pUVar29;
  undefined8 local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_90;
  long local_88;
  unsigned_long local_80;
  long *local_78;
  long local_70;
  long local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  pBVar15 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(*(BaseExpression **)(state + 8));
  pFVar16 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
            operator->((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                        *)(pBVar15 + 0x198));
  pvVar17 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                          *)(pBVar15 + 0x180),0);
  pEVar18 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(pvVar17);
  uVar14 = duckdb::DecimalType::GetScale((LogicalType *)(pEVar18 + 0x38));
  pvVar17 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                          *)(pBVar15 + 0x180),0);
  pEVar18 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(pvVar17);
  bVar13 = duckdb::DecimalType::GetWidth((LogicalType *)(pEVar18 + 0x38));
  iVar3 = *(int *)(pFVar16 + 8);
  VVar26 = (VectorType)result;
  if ((int)((uVar14 & 0xff) - (uint)bVar13) < iVar3) {
    sVar1 = *(short *)(&NumericHelper::POWERS_OF_TEN + (int)((uVar14 & 0xff) - iVar3));
    sVar2 = *(short *)(&NumericHelper::POWERS_OF_TEN + -(long)iVar3);
    sVar25 = (short)((uint)(int)(short)(sVar1 - (sVar1 >> 0xf)) >> 1);
    vector = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)input,0);
    pUVar4 = *(UnifiedVectorFormat **)(input + 0x18);
    if (*vector == (value_type)0x0) {
      duckdb::Vector::SetVectorType(VVar26);
      lVar9 = *(long *)(result + 0x20);
      lVar10 = *(long *)(vector + 0x20);
      FlatVector::VerifyFlatVector(vector);
      FlatVector::VerifyFlatVector(result);
      if (*(long *)(vector + 0x28) == 0) {
        if (pUVar4 != (UnifiedVectorFormat *)0x0) {
          pUVar29 = (UnifiedVectorFormat *)0x0;
          do {
            sVar22 = *(short *)(lVar10 + (long)pUVar29 * 2);
            sVar23 = sVar25;
            if (sVar22 < 0) {
              sVar23 = -sVar25;
            }
            *(short *)(lVar9 + (long)pUVar29 * 2) = ((short)(sVar23 + sVar22) / sVar1) * sVar2;
            pUVar29 = pUVar29 + 1;
          } while (pUVar4 != pUVar29);
        }
      }
      else {
        *(long *)(result + 0x28) = *(long *)(vector + 0x28);
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)(result + 0x30)
                   ,(shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                    (vector + 0x30));
        *(undefined8 *)(result + 0x40) = *(undefined8 *)(vector + 0x40);
        if ((UnifiedVectorFormat *)0x3f < pUVar4 + 0x3f) {
          lVar7 = *(long *)(vector + 0x28);
          uVar27 = 0;
          pUVar29 = (UnifiedVectorFormat *)0x0;
          do {
            if (lVar7 == 0) {
              pUVar19 = pUVar29 + 0x40;
              if (pUVar4 <= pUVar29 + 0x40) {
                pUVar19 = pUVar4;
              }
LAB_006bb4a7:
              pUVar28 = pUVar29;
              if (pUVar29 < pUVar19) {
                do {
                  sVar22 = *(short *)(lVar10 + (long)pUVar29 * 2);
                  sVar23 = sVar25;
                  if (sVar22 < 0) {
                    sVar23 = -sVar25;
                  }
                  *(short *)(lVar9 + (long)pUVar29 * 2) = ((short)(sVar23 + sVar22) / sVar1) * sVar2
                  ;
                  pUVar29 = pUVar29 + 1;
                  pUVar28 = pUVar19;
                } while (pUVar19 != pUVar29);
              }
            }
            else {
              uVar8 = *(ulong *)(lVar7 + uVar27 * 8);
              pUVar19 = pUVar29 + 0x40;
              if (pUVar4 <= pUVar29 + 0x40) {
                pUVar19 = pUVar4;
              }
              pUVar28 = pUVar19;
              if (uVar8 != 0) {
                if (uVar8 == 0xffffffffffffffff) goto LAB_006bb4a7;
                pUVar28 = pUVar29;
                if (pUVar29 < pUVar19) {
                  uVar24 = 0;
                  do {
                    if ((uVar8 >> (uVar24 & 0x3f) & 1) != 0) {
                      sVar22 = *(short *)(lVar10 + (long)pUVar29 * 2 + uVar24 * 2);
                      sVar23 = sVar25;
                      if (sVar22 < 0) {
                        sVar23 = -sVar25;
                      }
                      *(short *)(lVar9 + (long)pUVar29 * 2 + uVar24 * 2) =
                           ((short)(sVar23 + sVar22) / sVar1) * sVar2;
                    }
                    uVar24 = uVar24 + 1;
                    pUVar28 = pUVar19;
                  } while ((long)pUVar19 - (long)pUVar29 != uVar24);
                }
              }
            }
            uVar27 = uVar27 + 1;
            pUVar29 = pUVar28;
          } while (uVar27 != (ulong)(pUVar4 + 0x3f) >> 6);
        }
      }
    }
    else if (*vector == (value_type)0x2) {
      duckdb::Vector::SetVectorType(VVar26);
      psVar5 = *(short **)(result + 0x20);
      psVar6 = *(short **)(vector + 0x20);
      if ((*(byte **)(vector + 0x28) != (byte *)0x0) && ((**(byte **)(vector + 0x28) & 1) == 0)) {
        duckdb::ConstantVector::SetNull(result,true);
        return;
      }
      duckdb::ConstantVector::SetNull(result,false);
      sVar22 = -sVar25;
      if (-1 < *psVar6) {
        sVar22 = sVar25;
      }
      *psVar5 = sVar2 * ((short)(sVar22 + *psVar6) / sVar1);
    }
    else {
      duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
      duckdb::Vector::ToUnifiedFormat((ulong)vector,pUVar4);
      duckdb::Vector::SetVectorType(VVar26);
      lVar9 = *(long *)(result + 0x20);
      FlatVector::VerifyFlatVector(result);
      if (local_68 == 0) {
        if (pUVar4 != (UnifiedVectorFormat *)0x0) {
          lVar10 = *local_78;
          pUVar29 = (UnifiedVectorFormat *)0x0;
          do {
            pUVar19 = pUVar29;
            if (lVar10 != 0) {
              pUVar19 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar10 + (long)pUVar29 * 4);
            }
            sVar22 = *(short *)(local_70 + (long)pUVar19 * 2);
            sVar23 = sVar25;
            if (sVar22 < 0) {
              sVar23 = -sVar25;
            }
            *(short *)(lVar9 + (long)pUVar29 * 2) = ((short)(sVar23 + sVar22) / sVar1) * sVar2;
            pUVar29 = pUVar29 + 1;
          } while (pUVar4 != pUVar29);
        }
      }
      else if (pUVar4 != (UnifiedVectorFormat *)0x0) {
        lVar10 = *local_78;
        pUVar29 = (UnifiedVectorFormat *)0x0;
        local_88 = local_70;
        do {
          pUVar19 = pUVar29;
          if (lVar10 != 0) {
            pUVar19 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar10 + (long)pUVar29 * 4);
          }
          if ((*(ulong *)(local_68 + ((ulong)pUVar19 >> 6) * 8) >> ((ulong)pUVar19 & 0x3f) & 1) == 0
             ) {
            _Var21._M_head_impl = *(unsigned_long **)(result + 0x28);
            if (_Var21._M_head_impl == (unsigned_long *)0x0) {
              local_80 = *(unsigned_long *)(result + 0x40);
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_98,&local_80);
              p_Var12 = p_Stack_90;
              uVar11 = local_98;
              local_98 = 0;
              p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
              *(undefined8 *)(result + 0x30) = uVar11;
              *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38) = p_Var12;
              if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                 (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
                 p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
              }
              pTVar20 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *
                                   )(result + 0x30));
              _Var21._M_head_impl =
                   (pTVar20->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
              *(unsigned_long **)(result + 0x28) = _Var21._M_head_impl;
              local_70 = local_88;
            }
            bVar13 = (byte)pUVar29 & 0x3f;
            _Var21._M_head_impl[(ulong)pUVar29 >> 6] =
                 _Var21._M_head_impl[(ulong)pUVar29 >> 6] &
                 (-2L << bVar13 | 0xfffffffffffffffeU >> 0x40 - bVar13);
          }
          else {
            sVar22 = *(short *)(local_70 + (long)pUVar19 * 2);
            sVar23 = sVar25;
            if (sVar22 < 0) {
              sVar23 = -sVar25;
            }
            *(short *)(lVar9 + (long)pUVar29 * 2) = ((short)(sVar23 + sVar22) / sVar1) * sVar2;
          }
          pUVar29 = pUVar29 + 1;
        } while (pUVar4 != pUVar29);
      }
      if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
      }
      if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
      }
    }
  }
  else {
    duckdb::Vector::SetVectorType(VVar26);
    duckdb::Value::INTEGER((int)&local_78);
    duckdb::Vector::SetValue((ulong)result,(Value *)0x0);
    duckdb::Value::~Value((Value *)&local_78);
  }
  return;
}

Assistant:

static void DecimalRoundNegativePrecisionFunction(DataChunk &input, ExpressionState &state, Vector &result) {
	auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	auto &info = func_expr.bind_info->Cast<RoundPrecisionFunctionData>();
	auto source_scale = DecimalType::GetScale(func_expr.children[0]->return_type);
	auto width = DecimalType::GetWidth(func_expr.children[0]->return_type);
	if (info.target_scale <= -int32_t(width - source_scale)) {
		// scale too big for width
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
		result.SetValue(0, Value::INTEGER(0));
		return;
	}
	T divide_power_of_ten = UnsafeNumericCast<T>(POWERS_OF_TEN_CLASS::POWERS_OF_TEN[-info.target_scale + source_scale]);
	T multiply_power_of_ten = UnsafeNumericCast<T>(POWERS_OF_TEN_CLASS::POWERS_OF_TEN[-info.target_scale]);
	T addition = divide_power_of_ten / 2;

	UnaryExecutor::Execute<T, T>(input.data[0], result, input.size(), [&](T input) {
		if (input < 0) {
			input -= addition;
		} else {
			input += addition;
		}
		return UnsafeNumericCast<T>(input / divide_power_of_ten * multiply_power_of_ten);
	});
}